

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O3

Error asmjit::v1_14::CodeHolder_evaluateExpression(CodeHolder *self,Expression *exp,uint64_t *out)

{
  long lVar1;
  bool bVar2;
  Error EVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  ulong *puVar8;
  ulong local_58 [2];
  Expression *local_48;
  ulong local_40;
  ulong local_38;
  
  lVar4 = 0;
  puVar8 = local_58;
  bVar2 = true;
  local_48 = exp;
  do {
    bVar7 = bVar2;
    uVar5 = (ulong)(&(self->_environment)._subArch)[lVar4];
    if (3 < uVar5) {
      return 3;
    }
    switch(uVar5) {
    case 1:
      uVar5 = *(ulong *)(&self->_cpuFeatures + lVar4 * 8);
      break;
    case 2:
      lVar1 = *(long *)(*(long *)(&self->_cpuFeatures + lVar4 * 8) + 0x20);
      if (lVar1 == 0) {
        return 0x43;
      }
      uVar5 = *(long *)(*(long *)(&self->_cpuFeatures + lVar4 * 8) + 0x18) + *(long *)(lVar1 + 0x10)
      ;
      break;
    case 3:
      EVar3 = CodeHolder_evaluateExpression
                        (*(CodeHolder **)(&self->_cpuFeatures + lVar4 * 8),(Expression *)&local_38,
                         (uint64_t *)
                         ((long)&switchD_001192a7::switchdataD_0014c3d4 +
                         (long)(int)(&switchD_001192a7::switchdataD_0014c3d4)[uVar5]));
      uVar5 = local_38;
      if (EVar3 != 0) {
        return EVar3;
      }
    }
    *puVar8 = uVar5;
    lVar4 = 1;
    puVar8 = &local_40;
    bVar2 = false;
  } while (bVar7);
  switch((self->_environment)._arch) {
  case kUnknown:
    uVar5 = local_40 + local_58[0];
    break;
  case k32BitMask:
    uVar5 = local_58[0] - local_40;
    break;
  case kHost:
    uVar5 = local_40 * local_58[0];
    break;
  case kRISCV32:
    uVar6 = local_58[0] << ((byte)local_40 & 0x3f);
    goto LAB_00119352;
  case kRISCV64:
    uVar6 = local_58[0] >> ((byte)local_40 & 0x3f);
LAB_00119352:
    uVar5 = 0;
    if (local_40 < 0x40) {
      uVar5 = uVar6;
    }
    break;
  case kARM:
    uVar5 = 0x3f;
    if (local_40 < 0x3f) {
      uVar5 = local_40;
    }
    uVar5 = (long)local_58[0] >> ((byte)uVar5 & 0x3f);
    break;
  default:
    return 3;
  }
  local_48->opType = (char)uVar5;
  local_48->valueType[0] = (char)(uVar5 >> 8);
  local_48->valueType[1] = (char)(uVar5 >> 0x10);
  local_48->reserved[0] = (char)(uVar5 >> 0x18);
  local_48->reserved[1] = (char)(uVar5 >> 0x20);
  local_48->reserved[2] = (char)(uVar5 >> 0x28);
  local_48->reserved[3] = (char)(uVar5 >> 0x30);
  local_48->reserved[4] = (char)(uVar5 >> 0x38);
  return 0;
}

Assistant:

static Error CodeHolder_evaluateExpression(CodeHolder* self, Expression* exp, uint64_t* out) noexcept {
  uint64_t value[2];
  for (size_t i = 0; i < 2; i++) {
    uint64_t v;
    switch (exp->valueType[i]) {
      case ExpressionValueType::kNone: {
        v = 0;
        break;
      }

      case ExpressionValueType::kConstant: {
        v = exp->value[i].constant;
        break;
      }

      case ExpressionValueType::kLabel: {
        LabelEntry* le = exp->value[i].label;
        if (!le->isBound())
          return DebugUtils::errored(kErrorExpressionLabelNotBound);
        v = le->section()->offset() + le->offset();
        break;
      }

      case ExpressionValueType::kExpression: {
        Expression* nested = exp->value[i].expression;
        ASMJIT_PROPAGATE(CodeHolder_evaluateExpression(self, nested, &v));
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidState);
    }

    value[i] = v;
  }

  uint64_t result;
  uint64_t& a = value[0];
  uint64_t& b = value[1];

  switch (exp->opType) {
    case ExpressionOpType::kAdd:
      result = a + b;
      break;

    case ExpressionOpType::kSub:
      result = a - b;
      break;

    case ExpressionOpType::kMul:
      result = a * b;
      break;

    case ExpressionOpType::kSll:
      result = (b > 63) ? uint64_t(0) : uint64_t(a << b);
      break;

    case ExpressionOpType::kSrl:
      result = (b > 63) ? uint64_t(0) : uint64_t(a >> b);
      break;

    case ExpressionOpType::kSra:
      result = Support::sar(a, Support::min<uint64_t>(b, 63));
      break;

    default:
      return DebugUtils::errored(kErrorInvalidState);
  }

  *out = result;
  return kErrorOk;
}